

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

SupportVectorClassifier * __thiscall
CoreML::Specification::Model::mutable_supportvectorclassifier(Model *this)

{
  bool bVar1;
  SupportVectorClassifier *this_00;
  Model *this_local;
  
  bVar1 = has_supportvectorclassifier(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_supportvectorclassifier(this);
    this_00 = (SupportVectorClassifier *)operator_new(0xb0);
    SupportVectorClassifier::SupportVectorClassifier(this_00);
    (this->Type_).supportvectorclassifier_ = this_00;
  }
  return (SupportVectorClassifier *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::SupportVectorClassifier* Model::mutable_supportvectorclassifier() {
  if (!has_supportvectorclassifier()) {
    clear_Type();
    set_has_supportvectorclassifier();
    Type_.supportvectorclassifier_ = new ::CoreML::Specification::SupportVectorClassifier;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.supportVectorClassifier)
  return Type_.supportvectorclassifier_;
}